

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.h
# Opt level: O0

void __thiscall
hwnet::http::HttpResponse::HttpResponse
          (HttpResponse *this,shared_ptr<hwnet::http::HttpSession> *session,
          shared_ptr<hwnet::http::HttpPacket> *packet)

{
  shared_ptr<hwnet::http::HttpPacket> *packet_local;
  shared_ptr<hwnet::http::HttpSession> *session_local;
  HttpResponse *this_local;
  
  std::enable_shared_from_this<hwnet::http::HttpResponse>::enable_shared_from_this
            (&this->super_enable_shared_from_this<hwnet::http::HttpResponse>);
  std::shared_ptr<hwnet::http::HttpSession>::shared_ptr(&this->session,session);
  std::shared_ptr<hwnet::http::HttpPacket>::shared_ptr(&this->packet,packet);
  return;
}

Assistant:

HttpResponse(const std::shared_ptr<HttpSession> &session,const std::shared_ptr<HttpPacket> &packet):session(session),packet(packet) {

	}